

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O1

CTcSymbol * CTcSymPropBase::read_from_sym_file(CVmFile *fp)

{
  CTcPrsSymtab *this;
  short sVar1;
  byte bVar2;
  char *__s;
  size_t sVar3;
  CVmHashEntry *this_00;
  char *siz;
  char buf [81];
  byte local_78 [88];
  
  this_00 = (CVmHashEntry *)0x0;
  __s = CTcParser::read_len_prefix_str(fp,(char *)local_78,0x51,(size_t *)0x0,0x2db6);
  if (__s != (char *)0x0) {
    CVmFile::read_bytes(fp,(char *)local_78,1);
    this = G_prs->global_symtab_;
    sVar3 = strlen(__s);
    siz = __s;
    this_00 = (CVmHashEntry *)CTcPrsSymtab::find(this,__s,sVar3,(CTcPrsSymtab **)0x0);
    if (((this_00 == (CVmHashEntry *)0x0) || (*(int *)&this_00->field_0x24 != 3)) &&
       (((local_78[0] & 4) == 0 || (this_00 == (CVmHashEntry *)0x0)))) {
      this_00 = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)siz);
      sVar3 = strlen(__s);
      sVar1 = (short)*(undefined4 *)&G_cg->next_prop_;
      G_cg->next_prop_ = sVar1 + 1;
      CVmHashEntry::CVmHashEntry(this_00,__s,sVar3,0);
      bVar2 = *(byte *)((long)&this_00[1]._vptr_CVmHashEntry + 2) & 0xf8;
      *(undefined4 *)&this_00->field_0x24 = 3;
      *(short *)&this_00[1]._vptr_CVmHashEntry = sVar1;
      *(byte *)((long)&this_00[1]._vptr_CVmHashEntry + 2) = bVar2;
      this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003209a0;
      if ((local_78[0] & 4) != 0) {
        *(byte *)((long)&this_00[1]._vptr_CVmHashEntry + 2) = bVar2 | 4;
      }
    }
  }
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *CTcSymPropBase::read_from_sym_file(CVmFile *fp)
{
    /* read the symbol name */
    const char *sym;
    if ((sym = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read and decode the flags of interest */
    char flags = fp->read_byte();
    int weak = flags & 4;

    /* 
     *   If this property is already defined, this is a harmless redefinition
     *   - every symbol file can define the same property without any
     *   problem.  Indicate the harmless redefinition by returning the
     *   original symbol.  
     */
    CTcSymbol *old_entry = G_prs->get_global_symtab()->find(sym, strlen(sym));
    if (old_entry != 0 && old_entry->get_type() == TC_SYM_PROP)
        return old_entry;

    /* 
     *   if there's an old entry of a different type, and our entry is weak,
     *   the other symbol overrides our property definition 
     */
    if (old_entry != 0 && weak)
        return old_entry;

    /* create and return the new symbol */
    CTcSymProp *prop_entry =
        new CTcSymProp(sym, strlen(sym), FALSE, G_cg->new_prop_id());

    /* if our definition is weak, record that */
    if (weak)
        prop_entry->set_weak(TRUE);

    /* return the new entry */
    return prop_entry;
}